

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O1

TestStatus *
vkt::wsi::anon_unknown_0::basicRenderTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  InstanceDriver *vki;
  BinaryCollection *binaryRegistry;
  TestStatus *pTVar1;
  VkInstance device;
  VkResult VVar2;
  TestError *this;
  ulong uVar3;
  size_t numCommandBuffers;
  deUint32 imageNdx;
  VkFence imageReadyFence;
  VkPipelineStageFlags waitDstStage;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
  swapchainImages;
  VkSemaphore imageReadySemaphore;
  UVec2 desiredSize;
  NativeObjects native;
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  Unique<vk::Handle<(vk::HandleType)26>_> swapchain;
  VkCommandBuffer commandBuffer;
  VkSemaphore renderingCompleteSemaphore;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
  commandBuffers;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  renderingCompleteSemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  imageReadySemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  imageReadyFences;
  Unique<vk::Handle<(vk::HandleType)24>_> commandPool;
  VkPresentInfoKHR presentInfo;
  VkSubmitInfo submitInfo;
  VkSwapchainCreateInfoKHR swapchainInfo;
  InstanceHelper instHelper;
  DeviceHelper devHelper;
  TriangleRenderer renderer;
  SimpleAllocator allocator;
  deUint32 desiredImageCount;
  uint local_dfc;
  Context *local_df8;
  deUint64 local_df0;
  undefined4 local_de4;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> local_de0;
  undefined1 local_dc8 [32];
  Window *local_da8;
  VkSurfaceKHR local_d98;
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_d90;
  VkDevice local_d88;
  VkAllocationCallbacks *pVStack_d80;
  VkSwapchainKHR local_d78;
  Deleter<vk::Handle<(vk::HandleType)26>_> DStack_d70;
  TestStatus *local_d50;
  ulong local_d48;
  VkCommandBuffer local_d40;
  deUint64 local_d38;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> local_d30;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
  local_d18;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  local_d00;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  local_ce8;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  local_cd0;
  VkExtent2D local_cb8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_cb0;
  Enum<vk::VkResult,_4UL> local_c98;
  undefined4 local_c88;
  deUint64 *local_c80;
  undefined4 local_c78;
  VkSwapchainKHR *local_c70;
  uint *local_c68;
  undefined8 local_c60;
  undefined1 local_c58 [8];
  DeviceInterface *pDStack_c50;
  deUint32 local_c48;
  VkMemoryPropertyFlags VStack_c44;
  VkAllocationCallbacks *pVStack_c40;
  undefined4 *local_c38;
  deUint32 local_c30;
  VkCommandBuffer *local_c28;
  deUint32 local_c20;
  deUint64 *local_c18;
  ios_base local_be0 [408];
  VkSwapchainCreateInfoKHR local_a48;
  InstanceHelper local_9e0;
  undefined1 local_828 [8];
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_820;
  VkInstance local_818;
  VkAllocationCallbacks *pVStack_810;
  VkAllocationCallbacks *local_808;
  DeviceDriver local_800;
  VkQueue local_348;
  TriangleRenderer local_338;
  SimpleAllocator local_250;
  
  local_dc8._8_8_ = (PFN_vkAllocationFunction)0x10000000100;
  InstanceHelper::InstanceHelper(&local_9e0,context,wsiType,(VkAllocationCallbacks *)0x0);
  local_828 = (undefined1  [8])&aStack_820;
  aStack_820.m_align = local_dc8._8_8_;
  local_df8 = context;
  NativeObjects::NativeObjects
            ((NativeObjects *)(local_dc8 + 0x10),context,&local_9e0.supportedExtensions,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)local_828);
  vki = &local_9e0.vki;
  desiredImageCount = 0;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)local_828,&vki->super_InstanceInterface,
             local_9e0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             (Display *)local_dc8._16_8_,local_da8,(VkAllocationCallbacks *)0x0);
  local_d88 = (VkDevice)local_818;
  pVStack_d80 = pVStack_810;
  local_d98.m_internal = (deUint64)local_828;
  aStack_d90 = aStack_820;
  DeviceHelper::DeviceHelper
            ((DeviceHelper *)local_828,local_df8,&vki->super_InstanceInterface,
             local_9e0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
             (VkSurfaceKHR)local_828,(VkAllocationCallbacks *)0x0);
  device = local_818;
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)local_c58,&vki->super_InstanceInterface,
             (VkPhysicalDevice)local_828);
  ::vk::SimpleAllocator::SimpleAllocator
            (&local_250,&local_800.super_DeviceInterface,(VkDevice)device,
             (VkPhysicalDeviceMemoryProperties *)local_c58);
  getBasicSwapchainParameters
            (&local_a48,wsiType,&vki->super_InstanceInterface,(VkPhysicalDevice)local_828,local_d98,
             (UVec2 *)(local_dc8 + 8),desiredImageCount);
  ::vk::createSwapchainKHR
            ((Move<vk::Handle<(vk::HandleType)26>_> *)local_c58,&local_800.super_DeviceInterface,
             (VkDevice)device,&local_a48,(VkAllocationCallbacks *)0x0);
  DStack_d70.m_allocator = pVStack_c40;
  local_d78.m_internal = (deUint64)local_c58;
  DStack_d70.m_deviceIface = pDStack_c50;
  ::vk::wsi::getSwapchainImages
            (&local_de0,&local_800.super_DeviceInterface,(VkDevice)device,(VkSwapchainKHR)local_c58)
  ;
  binaryRegistry = local_df8->m_progCollection;
  std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
  vector(&local_d30,&local_de0);
  local_c58._0_4_ = local_a48.imageExtent.width;
  local_c58._4_4_ = local_a48.imageExtent.height;
  TriangleRenderer::TriangleRenderer
            (&local_338,&local_800.super_DeviceInterface,(VkDevice)device,&local_250.super_Allocator
             ,binaryRegistry,&local_d30,local_a48.imageFormat,(UVec2 *)local_c58);
  if (local_d30.
      super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d30.
                    super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d30.
                          super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d30.
                          super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  numCommandBuffers = 0;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_c58,&local_800.super_DeviceInterface,
             (VkDevice)device,2,aStack_820.m_align._0_4_,(VkAllocationCallbacks *)0x0);
  DStack_cb0.m_allocator = pVStack_c40;
  local_cb8.width = local_c58._0_4_;
  local_cb8.height = local_c58._4_4_;
  DStack_cb0.m_deviceIface = pDStack_c50;
  uVar3 = (long)local_de0.
                super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_de0.
                super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 2;
  createFences(&local_cd0,&local_800.super_DeviceInterface,(VkDevice)device,uVar3);
  createSemaphores(&local_ce8,&local_800.super_DeviceInterface,(VkDevice)device,uVar3 | 1);
  createSemaphores(&local_d00,&local_800.super_DeviceInterface,(VkDevice)device,uVar3);
  local_d50 = __return_storage_ptr__;
  local_d48 = uVar3;
  allocateCommandBuffers
            (&local_d18,&local_800.super_DeviceInterface,(VkDevice)device,(VkCommandPool)local_cb8,
             (VkCommandBufferLevel)uVar3,numCommandBuffers);
  uVar3 = 0;
  while( true ) {
    local_df0 = ((local_cd0.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [uVar3 % (ulong)((long)local_cd0.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_cd0.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
                super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal;
    local_dc8._0_8_ =
         ((local_ce8.
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [uVar3 % (ulong)((long)local_ce8.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_ce8.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
         super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
    local_dfc = 0xffffffff;
    if (local_d48 <= uVar3) {
      VVar2 = (*local_800.super_DeviceInterface._vptr_DeviceInterface[0x16])
                        (&local_800,device,1,&local_df0,1,0xffffffffffffffff);
      ::vk::checkResult(VVar2,
                        "vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x563);
    }
    VVar2 = (*local_800.super_DeviceInterface._vptr_DeviceInterface[0x14])
                      (&local_800,device,1,&local_df0);
    ::vk::checkResult(VVar2,"vkd.resetFences(device, 1, &imageReadyFence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x565);
    VVar2 = (*local_800.super_DeviceInterface._vptr_DeviceInterface[0x7b])
                      (&local_800,device,local_d78.m_internal,0xffffffffffffffff,local_dc8._0_8_,
                       local_df0,&local_dfc);
    if (VVar2 == VK_SUBOPTIMAL_KHR) {
      local_c58 = (undefined1  [8])local_df8->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_c50);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pDStack_c50,"Got ",4);
      local_c98.m_getName = ::vk::getResultName;
      local_c98.m_value = VK_SUBOPTIMAL_KHR;
      tcu::Format::Enum<vk::VkResult,_4UL>::toStream(&local_c98,(ostream *)&pDStack_c50);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pDStack_c50," at frame ",10);
      std::ostream::_M_insert<unsigned_long>((ulong)&pDStack_c50);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_c58,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_c50);
      std::ios_base::~ios_base(local_be0);
    }
    else {
      ::vk::checkResult(VVar2,"acquireResult",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x572);
    }
    if ((ulong)((long)local_de0.
                      super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_de0.
                      super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)local_dfc) break;
    local_d38 = ((local_d00.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [uVar3 % (ulong)((long)local_d00.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_d00.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
                super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
    local_d40 = ((local_d18.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [uVar3 % (ulong)((long)local_d18.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_d18.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
                super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object;
    local_de4 = 0x400;
    local_c58._0_4_ = 4;
    pDStack_c50 = (DeviceInterface *)0x0;
    local_c48 = 1;
    pVStack_c40 = (VkAllocationCallbacks *)local_dc8;
    local_c38 = &local_de4;
    local_c30 = 1;
    local_c28 = &local_d40;
    local_c20 = 1;
    local_c80 = &local_d38;
    local_c98.m_getName = (GetNameFunc)CONCAT44(local_c98.m_getName._4_4_,0x3b9acde9);
    local_c98.m_value = VK_SUCCESS;
    local_c98._12_4_ = 0;
    local_c88 = 1;
    local_c78 = 1;
    local_c70 = &local_d78;
    local_c68 = &local_dfc;
    local_c60 = 0;
    local_c18 = local_c80;
    TriangleRenderer::recordFrame(&local_338,local_d40,local_dfc,(deUint32)uVar3);
    VVar2 = (*local_800.super_DeviceInterface._vptr_DeviceInterface[2])
                      (&local_800,local_348,1,local_c58,0);
    ::vk::checkResult(VVar2,"vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x594);
    VVar2 = (*local_800.super_DeviceInterface._vptr_DeviceInterface[0x7c])
                      (&local_800,local_348,&local_c98);
    ::vk::checkResult(VVar2,"vkd.queuePresentKHR(devHelper.queue, &presentInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x595);
    uVar3 = uVar3 + 1;
    if (uVar3 == 600) {
      VVar2 = (*local_800.super_DeviceInterface._vptr_DeviceInterface[4])(&local_800,device);
      ::vk::checkResult(VVar2,"vkd.deviceWaitIdle(device)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x599);
      local_c58 = (undefined1  [8])&local_c48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c58,"Rendering tests succeeded","");
      pTVar1 = local_d50;
      local_d50->m_code = QP_TEST_RESULT_PASS;
      (local_d50->m_description)._M_dataplus._M_p = (pointer)&(local_d50->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d50->m_description,local_c58,
                 (long)&pDStack_c50->_vptr_DeviceInterface + (long)local_c58);
      if (local_c58 != (undefined1  [8])&local_c48) {
        operator_delete((void *)local_c58,CONCAT44(VStack_c44,local_c48) + 1);
      }
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
      ::~vector(&local_d18);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
      ::~vector(&local_d00);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
      ::~vector(&local_ce8);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
      ::~vector(&local_cd0);
      if (local_cb8 != (VkExtent2D)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  (&DStack_cb0,(VkCommandPool)local_cb8);
      }
      TriangleRenderer::~TriangleRenderer(&local_338);
      if (local_de0.
          super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_de0.
                        super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_de0.
                              super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_de0.
                              super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d78.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)26>_>::operator()
                  (&DStack_d70,local_d78);
      }
      ::vk::DeviceDriver::~DeviceDriver(&local_800);
      if (local_818 != (VkInstance)0x0) {
        (*(code *)pVStack_810)(local_818,local_808);
      }
      local_818 = (VkInstance)0x0;
      pVStack_810 = (VkAllocationCallbacks *)0x0;
      local_808 = (VkAllocationCallbacks *)0x0;
      if (local_d98.m_internal != 0) {
        (**(code **)(*(long *)aStack_d90 + 0x68))
                  (aStack_d90.m_align,local_d88,local_d98.m_internal,pVStack_d80);
      }
      if (local_da8 != (Window *)0x0) {
        (*local_da8->_vptr_Window[1])();
        local_da8 = (Window *)0x0;
      }
      if ((Display *)local_dc8._16_8_ != (Display *)0x0) {
        (**(code **)(*(long *)local_dc8._16_8_ + 8))();
        local_dc8._16_8_ = (Display *)0x0;
      }
      ::vk::InstanceDriver::~InstanceDriver(&local_9e0.vki);
      if (local_9e0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0) {
        (*local_9e0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
                  (local_9e0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
                   local_9e0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
      }
      local_9e0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object = (VkInstance_s *)0x0;
      local_9e0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance =
           (DestroyInstanceFunc)0x0;
      local_9e0.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      if (local_9e0.supportedExtensions.
          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_9e0.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_9e0.supportedExtensions.
                              super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_9e0.supportedExtensions.
                              super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return pTVar1;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"(size_t)imageNdx < swapchainImages.size()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
             ,0x575);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus basicRenderTest (Context& context, Type wsiType)
{
	const tcu::UVec2				desiredSize					(256, 256);
	const InstanceHelper			instHelper					(context, wsiType);
	const NativeObjects				native						(context, instHelper.supportedExtensions, wsiType, tcu::just(desiredSize));
	const Unique<VkSurfaceKHR>		surface						(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const DeviceHelper				devHelper					(context, instHelper.vki, *instHelper.instance, *surface);
	const DeviceInterface&			vkd							= devHelper.vkd;
	const VkDevice					device						= *devHelper.device;
	SimpleAllocator					allocator					(vkd, device, getPhysicalDeviceMemoryProperties(instHelper.vki, devHelper.physicalDevice));
	const VkSwapchainCreateInfoKHR	swapchainInfo				= getBasicSwapchainParameters(wsiType, instHelper.vki, devHelper.physicalDevice, *surface, desiredSize, 2);
	const Unique<VkSwapchainKHR>	swapchain					(createSwapchainKHR(vkd, device, &swapchainInfo));
	const vector<VkImage>			swapchainImages				= getSwapchainImages(vkd, device, *swapchain);

	const TriangleRenderer			renderer					(vkd,
																 device,
																 allocator,
																 context.getBinaryCollection(),
																 swapchainImages,
																 swapchainInfo.imageFormat,
																 tcu::UVec2(swapchainInfo.imageExtent.width, swapchainInfo.imageExtent.height));

	const Unique<VkCommandPool>		commandPool					(createCommandPool(vkd, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, devHelper.queueFamilyIndex));

	const size_t					maxQueuedFrames				= swapchainImages.size()*2;

	// We need to keep hold of fences from vkAcquireNextImageKHR to actually
	// limit number of frames we allow to be queued.
	const vector<FenceSp>			imageReadyFences			(createFences(vkd, device, maxQueuedFrames));

	// We need maxQueuedFrames+1 for imageReadySemaphores pool as we need to pass
	// the semaphore in same time as the fence we use to meter rendering.
	const vector<SemaphoreSp>		imageReadySemaphores		(createSemaphores(vkd, device, maxQueuedFrames+1));

	// For rest we simply need maxQueuedFrames as we will wait for image
	// from frameNdx-maxQueuedFrames to become available to us, guaranteeing that
	// previous uses must have completed.
	const vector<SemaphoreSp>		renderingCompleteSemaphores	(createSemaphores(vkd, device, maxQueuedFrames));
	const vector<CommandBufferSp>	commandBuffers				(allocateCommandBuffers(vkd, device, *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY, maxQueuedFrames));

	try
	{
		const deUint32	numFramesToRender	= 60*10;

		for (deUint32 frameNdx = 0; frameNdx < numFramesToRender; ++frameNdx)
		{
			const VkFence		imageReadyFence		= **imageReadyFences[frameNdx%imageReadyFences.size()];
			const VkSemaphore	imageReadySemaphore	= **imageReadySemaphores[frameNdx%imageReadySemaphores.size()];
			deUint32			imageNdx			= ~0u;

			if (frameNdx >= maxQueuedFrames)
				VK_CHECK(vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max()));

			VK_CHECK(vkd.resetFences(device, 1, &imageReadyFence));

			{
				const VkResult	acquireResult	= vkd.acquireNextImageKHR(device,
																		  *swapchain,
																		  std::numeric_limits<deUint64>::max(),
																		  imageReadySemaphore,
																		  imageReadyFence,
																		  &imageNdx);

				if (acquireResult == VK_SUBOPTIMAL_KHR)
					context.getTestContext().getLog() << TestLog::Message << "Got " << acquireResult << " at frame " << frameNdx << TestLog::EndMessage;
				else
					VK_CHECK(acquireResult);
			}

			TCU_CHECK((size_t)imageNdx < swapchainImages.size());

			{
				const VkSemaphore			renderingCompleteSemaphore	= **renderingCompleteSemaphores[frameNdx%renderingCompleteSemaphores.size()];
				const VkCommandBuffer		commandBuffer				= **commandBuffers[frameNdx%commandBuffers.size()];
				const VkPipelineStageFlags	waitDstStage				= VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
				const VkSubmitInfo			submitInfo					=
				{
					VK_STRUCTURE_TYPE_SUBMIT_INFO,
					DE_NULL,
					1u,
					&imageReadySemaphore,
					&waitDstStage,
					1u,
					&commandBuffer,
					1u,
					&renderingCompleteSemaphore
				};
				const VkPresentInfoKHR		presentInfo					=
				{
					VK_STRUCTURE_TYPE_PRESENT_INFO_KHR,
					DE_NULL,
					1u,
					&renderingCompleteSemaphore,
					1u,
					&*swapchain,
					&imageNdx,
					(VkResult*)DE_NULL
				};

				renderer.recordFrame(commandBuffer, imageNdx, frameNdx);
				VK_CHECK(vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0));
				VK_CHECK(vkd.queuePresentKHR(devHelper.queue, &presentInfo));
			}
		}

		VK_CHECK(vkd.deviceWaitIdle(device));
	}
	catch (...)
	{
		// Make sure device is idle before destroying resources
		vkd.deviceWaitIdle(device);
		throw;
	}

	return tcu::TestStatus::pass("Rendering tests succeeded");
}